

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.cc
# Opt level: O0

ts_nsec timed_fdb_iterator_init(fdb_kvs_handle *kv,fdb_iterator **it)

{
  fdb_status fVar1;
  ts_nsec start_00;
  ts_nsec end_00;
  fdb_iterator **in_RSI;
  fdb_kvs_handle *in_RDI;
  fdb_status status;
  ts_nsec end;
  ts_nsec start;
  undefined8 local_8;
  
  start_00 = get_monotonic_ts();
  fVar1 = fdb_iterator_init(in_RDI,in_RSI,(void *)0x0,0,(void *)0x0,0,0);
  end_00 = get_monotonic_ts();
  if (fVar1 == FDB_RESULT_SUCCESS) {
    local_8 = ts_diff(start_00,end_00);
  }
  else {
    local_8 = 0xffffffff;
  }
  return local_8;
}

Assistant:

ts_nsec timed_fdb_iterator_init(fdb_kvs_handle *kv, fdb_iterator **it){

    ts_nsec start, end;
    fdb_status status;

    start = get_monotonic_ts();
    status = fdb_iterator_init(kv, it, NULL, 0, NULL, 0, FDB_ITR_NONE);
    end = get_monotonic_ts();

    if(status == FDB_RESULT_SUCCESS){
      return ts_diff(start, end);
    } else {
      return ERR_NS;
    }


}